

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> * __thiscall
discordpp::field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>::operator=
          (field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> *this,
          field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> *f)

{
  bool bVar1;
  type __x;
  pointer local_58;
  field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> *f_local;
  field<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    local_58 = (pointer)operator_new(0x18);
    __x = std::
          unique_ptr<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
          ::operator*(&f->t_);
    std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>::vector(local_58,__x);
  }
  else {
    local_58 = (pointer)0x0;
  }
  std::
  unique_ptr<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>,_std::default_delete<std::vector<discordpp::Sticker,_std::allocator<discordpp::Sticker>_>_>_>
  ::reset(&this->t_,local_58);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }